

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

string * __thiscall
libtorrent::mmap_cache_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,mmap_cache_alert *this)

{
  uint uVar1;
  undefined8 uVar2;
  allocator<char> local_2c5 [13];
  string local_2b8;
  string local_298;
  char local_278 [8];
  char msg [600];
  mmap_cache_alert *this_local;
  
  uVar1 = boost::system::error_code::value(&this->error);
  boost::system::error_code::message_abi_cxx11_(&local_2b8,&this->error);
  convert_from_native(&local_298,&local_2b8);
  uVar2 = std::__cxx11::string::c_str();
  snprintf(local_278,600,"mmap cache failed: (%d) %s",(ulong)uVar1,uVar2);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_278,local_2c5);
  std::allocator<char>::~allocator(local_2c5);
  return __return_storage_ptr__;
}

Assistant:

std::string mmap_cache_alert::message() const
	{
		char msg[600];
		std::snprintf(msg, sizeof(msg), "mmap cache failed: (%d) %s", error.value()
			, convert_from_native(error.message()).c_str());
		return msg;
	}